

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_write_state.cpp
# Opt level: O1

void __thiscall
duckdb::WALWriteState::WriteCatalogEntry(WALWriteState *this,CatalogEntry *entry,data_ptr_t dataptr)

{
  CatalogType CVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  CatalogEntry *pCVar3;
  IndexCatalogEntry *entry_00;
  AlterInfo *info;
  InternalException *pIVar4;
  ulong uVar5;
  uint uVar6;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> parse_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_name;
  MemoryStream source;
  BinaryDeserializer deserializer;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> local_310;
  undefined1 local_308 [8];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  MemoryStream local_2e0;
  BinaryDeserializer local_2b0;
  
  if (entry->temporary != false) {
    return;
  }
  pCVar3 = CatalogEntry::Parent(entry);
  if (pCVar3->temporary != false) {
    return;
  }
  entry_00 = (IndexCatalogEntry *)CatalogEntry::Parent(entry);
  CVar1 = (entry_00->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type;
  if (CVar1 < 0x47) {
    uVar6 = (uint)CVar1;
    if (uVar6 < 0x35) {
      uVar5 = (ulong)uVar6;
      if ((0x1000003e0000a0U >> (uVar5 & 0x3f) & 1) != 0) {
        return;
      }
      if ((0xc0000158UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_01810b41;
      if (uVar5 == 0x33) {
        CVar1 = entry->type;
        switch(CVar1) {
        case TABLE_ENTRY:
          WriteAheadLog::WriteDropTable(this->log,(TableCatalogEntry *)entry);
          return;
        case SCHEMA_ENTRY:
          WriteAheadLog::WriteDropSchema(this->log,(SchemaCatalogEntry *)entry);
          return;
        case VIEW_ENTRY:
          WriteAheadLog::WriteDropView(this->log,(ViewCatalogEntry *)entry);
          return;
        case INDEX_ENTRY:
          WriteAheadLog::WriteDropIndex(this->log,(IndexCatalogEntry *)entry);
          return;
        case PREPARED_STATEMENT:
          return;
        case SEQUENCE_ENTRY:
          WriteAheadLog::WriteDropSequence(this->log,(SequenceCatalogEntry *)entry);
          return;
        case COLLATION_ENTRY:
          goto switchD_01810e83_caseD_7;
        case TYPE_ENTRY:
          WriteAheadLog::WriteDropType(this->log,(TypeCatalogEntry *)entry);
          return;
        default:
          uVar5 = (ulong)(CVar1 - 0x1a);
          if (CVar1 - 0x1a < 0x30) {
            if ((0xe00004000001U >> (uVar5 & 0x3f) & 1) != 0) {
              return;
            }
            if (uVar5 == 4) {
              WriteAheadLog::WriteDropMacro(this->log,(ScalarMacroCatalogEntry *)entry);
              return;
            }
            if (uVar5 == 5) {
              WriteAheadLog::WriteDropTableMacro(this->log,(TableMacroCatalogEntry *)entry);
              return;
            }
          }
          if (CVar1 == DEPENDENCY_ENTRY) {
            return;
          }
switchD_01810e83_caseD_7:
          pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
          local_2b0.super_Deserializer._vptr_Deserializer =
               (_func_int **)&local_2b0.super_Deserializer.data;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b0,"Don\'t know how to drop this type!","");
          InternalException::InternalException(pIVar4,(string *)&local_2b0);
          __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    if (uVar6 == 1) {
LAB_01810b41:
      if ((entry->type == RENAMED_ENTRY) || (entry->type == CVar1)) {
        MemoryStream::MemoryStream(&local_2e0,dataptr + 8,*(idx_t *)dataptr);
        local_2b0.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_0247c408;
        local_2b0.super_Deserializer.deserialize_enum_from_string = false;
        SerializationData::SerializationData(&local_2b0.super_Deserializer.data);
        local_2b0.stream = &local_2e0.super_ReadStream;
        local_2b0.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_02490d70;
        local_2b0.nesting_level = 0;
        local_2b0.has_buffered_field = false;
        local_2b0.buffered_field = 0;
        local_2b0.super_Deserializer.deserialize_enum_from_string = false;
        BinaryDeserializer::OnObjectBegin(&local_2b0);
        (*local_2b0.super_Deserializer._vptr_Deserializer[2])(&local_2b0,100,"column_name");
        (*local_2b0.super_Deserializer._vptr_Deserializer[0x1a])(local_300);
        (*local_2b0.super_Deserializer._vptr_Deserializer[3])();
        (*local_2b0.super_Deserializer._vptr_Deserializer[2])(&local_2b0,0x65,"alter_info");
        local_310._M_head_impl = (ParseInfo *)0x0;
        iVar2 = (*local_2b0.super_Deserializer._vptr_Deserializer[10])();
        if ((char)iVar2 != '\0') {
          (*local_2b0.super_Deserializer._vptr_Deserializer[6])();
          ParseInfo::Deserialize((ParseInfo *)local_308,&local_2b0.super_Deserializer);
          local_310._M_head_impl = (ParseInfo *)local_308;
          (*local_2b0.super_Deserializer._vptr_Deserializer[7])();
        }
        (*local_2b0.super_Deserializer._vptr_Deserializer[0xb])();
        (*local_2b0.super_Deserializer._vptr_Deserializer[3])();
        BinaryDeserializer::OnObjectEnd(&local_2b0);
        info = (AlterInfo *)
               unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::
               operator->((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
                           *)&local_310);
        WriteAheadLog::WriteAlter(this->log,entry,info);
        if (local_310._M_head_impl != (ParseInfo *)0x0) {
          (*(local_310._M_head_impl)->_vptr_ParseInfo[1])();
        }
        if (local_300[0] != local_2f0) {
          operator_delete(local_300[0]);
        }
        Deserializer::~Deserializer(&local_2b0.super_Deserializer);
        MemoryStream::~MemoryStream(&local_2e0);
        return;
      }
      uVar6 = CVar1 - 1;
      if (uVar6 < 8) {
        switch((uint)CVar1) {
        case 1:
          UNRECOVERED_JUMPTABLE = this->log->_vptr_WriteAheadLog[2];
          (*UNRECOVERED_JUMPTABLE)
                    (this->log,entry_00,
                     (long)&switchD_01810b68::switchdataD_01e539dc +
                     (long)(int)(&switchD_01810b68::switchdataD_01e539dc)[uVar6],
                     UNRECOVERED_JUMPTABLE);
          return;
        case 3:
          WriteAheadLog::WriteCreateView(this->log,(ViewCatalogEntry *)entry_00);
          return;
        case 4:
          WriteAheadLog::WriteCreateIndex(this->log,entry_00);
          return;
        case 6:
          WriteAheadLog::WriteCreateSequence(this->log,(SequenceCatalogEntry *)entry_00);
          return;
        case 8:
          WriteAheadLog::WriteCreateType(this->log,(TypeCatalogEntry *)entry_00);
          return;
        }
      }
      else {
        if (CVar1 == MACRO_ENTRY) {
          WriteAheadLog::WriteCreateMacro(this->log,(ScalarMacroCatalogEntry *)entry_00);
          return;
        }
        if (CVar1 == TABLE_MACRO_ENTRY) {
          WriteAheadLog::WriteCreateTableMacro(this->log,(TableMacroCatalogEntry *)entry_00);
          return;
        }
      }
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      local_2b0.super_Deserializer._vptr_Deserializer =
           (_func_int **)&local_2b0.super_Deserializer.data;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,"Don\'t know how to create this type!","");
      InternalException::InternalException(pIVar4,(string *)&local_2b0);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (uVar6 == 2) {
      if (entry->type == SCHEMA_ENTRY) {
        return;
      }
      if (entry->type == RENAMED_ENTRY) {
        return;
      }
      WriteAheadLog::WriteCreateSchema(this->log,(SchemaCatalogEntry *)entry_00);
      return;
    }
  }
  else {
    uVar6 = CVar1 - 0x47;
    if ((uVar6 < 0x1e) && ((0x20000007U >> (uVar6 & 0x1f) & 1) != 0)) {
      return;
    }
  }
  pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
  local_2b0.super_Deserializer._vptr_Deserializer = (_func_int **)&local_2b0.super_Deserializer.data
  ;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,"UndoBuffer - don\'t know how to write this entry to the WAL","");
  InternalException::InternalException(pIVar4,(string *)&local_2b0);
  __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void WALWriteState::WriteCatalogEntry(CatalogEntry &entry, data_ptr_t dataptr) {
	if (entry.temporary || entry.Parent().temporary) {
		return;
	}

	// look at the type of the parent entry
	auto &parent = entry.Parent();

	switch (parent.type) {
	case CatalogType::TABLE_ENTRY:
	case CatalogType::VIEW_ENTRY:
	case CatalogType::INDEX_ENTRY:
	case CatalogType::SEQUENCE_ENTRY:
	case CatalogType::TYPE_ENTRY:
	case CatalogType::MACRO_ENTRY:
	case CatalogType::TABLE_MACRO_ENTRY:
		if (entry.type == CatalogType::RENAMED_ENTRY || entry.type == parent.type) {
			// ALTER statement, read the extra data after the entry
			auto extra_data_size = Load<idx_t>(dataptr);
			auto extra_data = data_ptr_cast(dataptr + sizeof(idx_t));

			MemoryStream source(extra_data, extra_data_size);
			BinaryDeserializer deserializer(source);
			deserializer.Begin();
			auto column_name = deserializer.ReadProperty<string>(100, "column_name");
			auto parse_info = deserializer.ReadProperty<unique_ptr<ParseInfo>>(101, "alter_info");
			deserializer.End();

			auto &alter_info = parse_info->Cast<AlterInfo>();
			log.WriteAlter(entry, alter_info);
		} else {
			switch (parent.type) {
			case CatalogType::TABLE_ENTRY:
				// CREATE TABLE statement
				log.WriteCreateTable(parent.Cast<TableCatalogEntry>());
				break;
			case CatalogType::VIEW_ENTRY:
				// CREATE VIEW statement
				log.WriteCreateView(parent.Cast<ViewCatalogEntry>());
				break;
			case CatalogType::INDEX_ENTRY:
				// CREATE INDEX statement
				log.WriteCreateIndex(parent.Cast<IndexCatalogEntry>());
				break;
			case CatalogType::SEQUENCE_ENTRY:
				// CREATE SEQUENCE statement
				log.WriteCreateSequence(parent.Cast<SequenceCatalogEntry>());
				break;
			case CatalogType::TYPE_ENTRY:
				// CREATE TYPE statement
				log.WriteCreateType(parent.Cast<TypeCatalogEntry>());
				break;
			case CatalogType::MACRO_ENTRY:
				log.WriteCreateMacro(parent.Cast<ScalarMacroCatalogEntry>());
				break;
			case CatalogType::TABLE_MACRO_ENTRY:
				log.WriteCreateTableMacro(parent.Cast<TableMacroCatalogEntry>());
				break;
			default:
				throw InternalException("Don't know how to create this type!");
			}
		}
		break;
	case CatalogType::SCHEMA_ENTRY:
		if (entry.type == CatalogType::RENAMED_ENTRY || entry.type == CatalogType::SCHEMA_ENTRY) {
			// ALTER TABLE statement, skip it
			return;
		}
		log.WriteCreateSchema(parent.Cast<SchemaCatalogEntry>());
		break;
	case CatalogType::RENAMED_ENTRY:
		// This is a rename, nothing needs to be done for this
		break;
	case CatalogType::DELETED_ENTRY:
		switch (entry.type) {
		case CatalogType::TABLE_ENTRY: {
			auto &table_entry = entry.Cast<DuckTableEntry>();
			D_ASSERT(table_entry.IsDuckTable());
			log.WriteDropTable(table_entry);
			break;
		}
		case CatalogType::SCHEMA_ENTRY:
			log.WriteDropSchema(entry.Cast<SchemaCatalogEntry>());
			break;
		case CatalogType::VIEW_ENTRY:
			log.WriteDropView(entry.Cast<ViewCatalogEntry>());
			break;
		case CatalogType::SEQUENCE_ENTRY:
			log.WriteDropSequence(entry.Cast<SequenceCatalogEntry>());
			break;
		case CatalogType::MACRO_ENTRY:
			log.WriteDropMacro(entry.Cast<ScalarMacroCatalogEntry>());
			break;
		case CatalogType::TABLE_MACRO_ENTRY:
			log.WriteDropTableMacro(entry.Cast<TableMacroCatalogEntry>());
			break;
		case CatalogType::TYPE_ENTRY:
			log.WriteDropType(entry.Cast<TypeCatalogEntry>());
			break;
		case CatalogType::INDEX_ENTRY: {
			log.WriteDropIndex(entry.Cast<IndexCatalogEntry>());
			break;
		}
		case CatalogType::RENAMED_ENTRY:
		case CatalogType::PREPARED_STATEMENT:
		case CatalogType::SCALAR_FUNCTION_ENTRY:
		case CatalogType::DEPENDENCY_ENTRY:
		case CatalogType::SECRET_ENTRY:
		case CatalogType::SECRET_TYPE_ENTRY:
		case CatalogType::SECRET_FUNCTION_ENTRY:
			// do nothing, prepared statements and scalar functions aren't persisted to disk
			break;
		default:
			throw InternalException("Don't know how to drop this type!");
		}
		break;
	case CatalogType::PREPARED_STATEMENT:
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
	case CatalogType::SCALAR_FUNCTION_ENTRY:
	case CatalogType::TABLE_FUNCTION_ENTRY:
	case CatalogType::COPY_FUNCTION_ENTRY:
	case CatalogType::PRAGMA_FUNCTION_ENTRY:
	case CatalogType::COLLATION_ENTRY:
	case CatalogType::DEPENDENCY_ENTRY:
	case CatalogType::SECRET_ENTRY:
	case CatalogType::SECRET_TYPE_ENTRY:
	case CatalogType::SECRET_FUNCTION_ENTRY:
		// do nothing, these entries are not persisted to disk
		break;
	default:
		throw InternalException("UndoBuffer - don't know how to write this entry to the WAL");
	}
}